

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

predictor * __thiscall
Search::predictor::add_condition_range(predictor *this,ptag hi,ptag count,char name0)

{
  uint uVar1;
  char name;
  char local_41;
  uint local_40;
  ptag local_3c;
  predictor *local_38;
  
  local_38 = this;
  if (count != 0) {
    local_40 = hi;
    for (uVar1 = 0; (uVar1 < count && (uVar1 <= local_40)); uVar1 = uVar1 + 1) {
      local_41 = (char)uVar1 + name0;
      local_3c = hi;
      v_array<unsigned_int>::push_back(&this->condition_on_tags,&local_3c);
      v_array<char>::push_back(&this->condition_on_names,&local_41);
      hi = hi - 1;
    }
  }
  return local_38;
}

Assistant:

predictor& predictor::add_condition_range(ptag hi, ptag count, char name0)
{
  if (count == 0)
    return *this;
  for (ptag i = 0; i < count; i++)
  {
    if (i > hi)
      break;
    char name = name0 + i;
    condition_on_tags.push_back(hi - i);
    condition_on_names.push_back(name);
  }
  return *this;
}